

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

bool wallet::coinselector_tests::EquivalentResult(SelectionResult *a,SelectionResult *b)

{
  pair<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  pVar1;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar2;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  pair<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  pVar4;
  vector<long,_std::allocator<long>_> b_amts;
  vector<long,_std::allocator<long>_> a_amts;
  _Vector_base<long,_std::allocator<long>_> local_68;
  _Vector_base<long,_std::allocator<long>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (long *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (long *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = SelectionResult::GetInputSet(a);
  for (p_Var3 = (psVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    ::_GLOBAL__N_1::std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&local_48,
               (value_type_conflict6 *)(*(long *)(p_Var3 + 1) + 0x48));
  }
  psVar2 = SelectionResult::GetInputSet(b);
  for (p_Var3 = (psVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    ::_GLOBAL__N_1::std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&local_68,
               (value_type_conflict6 *)(*(long *)(p_Var3 + 1) + 0x48));
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_48._M_impl.super__Vector_impl_data._M_start,
             local_48._M_impl.super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_68._M_impl.super__Vector_impl_data._M_start,
             local_68._M_impl.super__Vector_impl_data._M_finish);
  pVar4 = std::
          __mismatch<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (local_48._M_impl.super__Vector_impl_data._M_start,
                     local_48._M_impl.super__Vector_impl_data._M_finish,
                     local_68._M_impl.super__Vector_impl_data._M_start);
  pVar1.second._M_current = local_68._M_impl.super__Vector_impl_data._M_finish;
  pVar1.first._M_current = local_48._M_impl.super__Vector_impl_data._M_finish;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pVar4 == pVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool EquivalentResult(const SelectionResult& a, const SelectionResult& b)
{
    std::vector<CAmount> a_amts;
    std::vector<CAmount> b_amts;
    for (const auto& coin : a.GetInputSet()) {
        a_amts.push_back(coin->txout.nValue);
    }
    for (const auto& coin : b.GetInputSet()) {
        b_amts.push_back(coin->txout.nValue);
    }
    std::sort(a_amts.begin(), a_amts.end());
    std::sort(b_amts.begin(), b_amts.end());

    std::pair<std::vector<CAmount>::iterator, std::vector<CAmount>::iterator> ret = std::mismatch(a_amts.begin(), a_amts.end(), b_amts.begin());
    return ret.first == a_amts.end() && ret.second == b_amts.end();
}